

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressStream(ZSTD_DStream *zds,ZSTD_outBuffer *output,ZSTD_inBuffer *input)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  bool bVar1;
  uint uVar2;
  U32 UVar3;
  int iVar4;
  ZSTD_nextInputType_e ZVar5;
  ulong __n;
  ulong __n_00;
  char *pcVar6;
  size_t sVar7;
  ZSTD_DCtx *pZVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  ulong *in_RDX;
  ZSTD_outBuffer *in_RSI;
  ZSTD_DStream *in_RDI;
  size_t nextSrcSizeHint;
  size_t flushedSize;
  size_t toFlushSize;
  size_t err_code_5;
  size_t loadedSize;
  int isSkipFrame;
  size_t toLoad_1;
  size_t neededInSize_1;
  size_t err_code_4;
  size_t neededInSize;
  size_t bufferSize;
  int tooLarge;
  int tooSmall;
  size_t neededOutBuffSize;
  size_t neededInBuffSize;
  size_t err_code_3;
  size_t err_code_2;
  size_t decompressedSize;
  size_t cSize;
  size_t err_code_1;
  size_t remainingInput;
  size_t toLoad;
  size_t hSize;
  size_t err_code;
  U32 someMoreWork;
  char *op;
  char *oend;
  char *ostart;
  char *dst;
  char *ip;
  char *iend;
  char *istart;
  char *src;
  ZSTD_DCtx *in_stack_fffffffffffffe28;
  ZSTD_DCtx *in_stack_fffffffffffffe30;
  ZSTD_DDict *in_stack_fffffffffffffe38;
  ZSTD_DDict *in_stack_fffffffffffffe40;
  ZSTD_DCtx *in_stack_fffffffffffffe48;
  void *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  bool bVar13;
  ZSTD_DCtx *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  void *in_stack_fffffffffffffe70;
  ZSTD_DStream *in_stack_fffffffffffffe78;
  ZSTD_DDict *in_stack_fffffffffffffe80;
  ZSTD_DStream *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffeb0;
  ZSTD_format_e format;
  ZSTD_DDict *pZVar14;
  ZSTD_DDict *src_00;
  ZSTD_DDict *pZVar15;
  ZSTD_DDict *zfhPtr;
  void *local_130;
  void *local_128;
  ZSTD_DCtx *local_100;
  ZSTD_DDict *local_60;
  void *local_40;
  size_t local_8;
  
  local_130 = (void *)*in_RDX;
  local_128 = local_130;
  if (in_RDX[2] != 0) {
    local_128 = (void *)((long)local_130 + in_RDX[2]);
  }
  if (in_RDX[1] != 0) {
    local_130 = (void *)((long)local_130 + in_RDX[1]);
  }
  local_40 = local_128;
  pZVar14 = (ZSTD_DDict *)in_RSI->dst;
  pZVar15 = pZVar14;
  if (in_RSI->pos != 0) {
    pZVar15 = (ZSTD_DDict *)((long)((pZVar14->entropy).LLTable + -3) + in_RSI->pos);
  }
  if (in_RSI->size != 0) {
    pZVar14 = (ZSTD_DDict *)((long)((pZVar14->entropy).LLTable + -3) + in_RSI->size);
  }
  bVar1 = true;
  if (in_RDX[1] < in_RDX[2]) {
    local_8 = 0xffffffffffffffb8;
  }
  else if (in_RSI->size < in_RSI->pos) {
    local_8 = 0xffffffffffffffba;
  }
  else {
    src_00 = pZVar14;
    zfhPtr = pZVar15;
    local_8 = ZSTD_checkOutBuffer(in_RDI,in_RSI);
    uVar2 = ERR_isError(local_8);
    local_60 = pZVar15;
    if (uVar2 == 0) {
      do {
        if (!bVar1) {
          in_RDX[2] = (long)local_40 - *in_RDX;
          in_RSI->pos = (long)local_60 - (long)in_RSI->dst;
          (in_RDI->expectedOutBuffer).dst = in_RSI->dst;
          (in_RDI->expectedOutBuffer).size = in_RSI->size;
          (in_RDI->expectedOutBuffer).pos = in_RSI->pos;
          if ((local_40 == local_128) && (local_60 == pZVar15)) {
            in_RDI->noForwardProgress = in_RDI->noForwardProgress + 1;
            if (0xf < in_RDI->noForwardProgress) {
              if (local_60 == pZVar14) {
                return 0xffffffffffffffb0;
              }
              if (local_40 == local_130) {
                return 0xffffffffffffffae;
              }
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa44d,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
          }
          else {
            in_RDI->noForwardProgress = 0;
          }
          sVar11 = ZSTD_nextSrcSizeToDecompress(in_RDI);
          if (sVar11 != 0) {
            ZVar5 = ZSTD_nextInputType(in_stack_fffffffffffffe28);
            uVar12 = (long)(int)(uint)(ZVar5 == ZSTDnit_block) * 3 + sVar11;
            if (in_RDI->inPos <= uVar12) {
              return uVar12 - in_RDI->inPos;
            }
            __assert_fail("zds->inPos <= nextSrcSizeHint",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa466,
                          "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                         );
          }
          if (in_RDI->outEnd == in_RDI->outStart) {
            if (in_RDI->hostageByte != 0) {
              if (in_RDX[1] <= in_RDX[2]) {
                in_RDI->streamStage = zdss_read;
                return 1;
              }
              in_RDX[2] = in_RDX[2] + 1;
            }
            return 0;
          }
          if (in_RDI->hostageByte == 0) {
            in_RDX[2] = in_RDX[2] - 1;
            in_RDI->hostageByte = 1;
          }
          return 1;
        }
        uVar12 = (ulong)in_RDI->streamStage;
        switch(uVar12) {
        case 0:
          in_RDI->streamStage = zdss_loadHeader;
          in_RDI->outEnd = 0;
          in_RDI->outStart = 0;
          in_RDI->inPos = 0;
          in_RDI->lhSize = 0;
          in_RDI->hostageByte = 0;
          (in_RDI->expectedOutBuffer).dst = in_RSI->dst;
          (in_RDI->expectedOutBuffer).size = in_RSI->size;
          (in_RDI->expectedOutBuffer).pos = in_RSI->pos;
        case 1:
          sVar11 = ZSTD_getFrameHeader_advanced
                             ((ZSTD_frameHeader *)zfhPtr,src_00,uVar12,
                              (ZSTD_format_e)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
          if ((in_RDI->refMultipleDDicts != ZSTD_rmd_refSingleDDict) &&
             (in_RDI->ddictSet != (ZSTD_DDictHashSet *)0x0)) {
            ZSTD_DCtx_selectFrameDDict(in_stack_fffffffffffffe30);
          }
          uVar2 = ZSTD_isError(0x2f7e2f);
          format = (ZSTD_format_e)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
          if (uVar2 != 0) {
            return sVar11;
          }
          if (sVar11 == 0) {
            if (((((in_RDI->fParams).frameContentSize == 0xffffffffffffffff) ||
                 ((in_RDI->fParams).frameType == ZSTD_skippableFrame)) ||
                ((ulong)((long)pZVar14 - (long)local_60) < (in_RDI->fParams).frameContentSize)) ||
               (sVar11 = ZSTD_findFrameCompressedSize
                                   (in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38),
               (ulong)((long)local_130 - (long)local_128) < sVar11)) {
              if (((in_RDI->outBufferMode == ZSTD_bm_stable) &&
                  ((in_RDI->fParams).frameType != ZSTD_skippableFrame)) &&
                 (((in_RDI->fParams).frameContentSize != 0xffffffffffffffff &&
                  ((ulong)((long)pZVar14 - (long)local_60) < (in_RDI->fParams).frameContentSize))))
              {
                return 0xffffffffffffffba;
              }
              in_stack_fffffffffffffe78 = in_RDI;
              ZSTD_getDDict(in_stack_fffffffffffffe28);
              sVar11 = ZSTD_decompressBegin_usingDDict
                                 (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
              uVar2 = ERR_isError(sVar11);
              if (uVar2 != 0) {
                return sVar11;
              }
              UVar3 = MEM_readLE32(in_stack_fffffffffffffe28);
              if ((UVar3 & 0xfffffff0) == 0x184d2a50) {
                UVar3 = MEM_readLE32(in_stack_fffffffffffffe28);
                in_RDI->expected = (ulong)UVar3;
                in_RDI->stage = ZSTDds_skipFrame;
              }
              else {
                sVar11 = ZSTD_decodeFrameHeader
                                   (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                                    (size_t)in_stack_fffffffffffffe38);
                uVar2 = ERR_isError(sVar11);
                if (uVar2 != 0) {
                  return sVar11;
                }
                in_RDI->expected = 3;
                in_RDI->stage = ZSTDds_decodeBlockHeader;
              }
              if ((in_RDI->fParams).windowSize < 0x401) {
                in_stack_fffffffffffffe70 = (void *)0x400;
              }
              else {
                in_stack_fffffffffffffe70 = (void *)(in_RDI->fParams).windowSize;
              }
              (in_RDI->fParams).windowSize = (unsigned_long_long)in_stack_fffffffffffffe70;
              if (in_RDI->maxWindowSize < (in_RDI->fParams).windowSize) {
                return 0xfffffffffffffff0;
              }
              if ((in_RDI->fParams).blockSizeMax < 5) {
                in_stack_fffffffffffffe6c = 4;
              }
              else {
                in_stack_fffffffffffffe6c = (in_RDI->fParams).blockSizeMax;
              }
              uVar12 = (ulong)in_stack_fffffffffffffe6c;
              if (in_RDI->outBufferMode == ZSTD_bm_buffered) {
                pZVar8 = (ZSTD_DCtx *)
                         ZSTD_decodingBufferSize_min
                                   ((in_RDI->fParams).windowSize,(in_RDI->fParams).frameContentSize)
                ;
              }
              else {
                pZVar8 = (ZSTD_DCtx *)0x0;
              }
              in_stack_fffffffffffffe60 = pZVar8;
              ZSTD_DCtx_updateOversizedDuration
                        (in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28,0x2f85b4);
              bVar13 = true;
              if (uVar12 <= in_RDI->inBuffSize) {
                bVar13 = (ZSTD_DCtx *)in_RDI->outBuffSize < pZVar8;
              }
              in_stack_fffffffffffffe5f = bVar13;
              iVar4 = ZSTD_DCtx_isOversizedTooLong(in_RDI);
              if ((bVar13 != false) || (iVar4 != 0)) {
                if (in_RDI->staticSize == 0) {
                  customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffe48;
                  customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffe40;
                  customMem.opaque = in_stack_fffffffffffffe50;
                  ZSTD_customFree((in_RDI->customMem).customFree,customMem);
                  in_RDI->inBuffSize = 0;
                  in_RDI->outBuffSize = 0;
                  in_stack_fffffffffffffe28 = (ZSTD_DCtx *)(in_RDI->customMem).customAlloc;
                  in_stack_fffffffffffffe30 = (ZSTD_DCtx *)(in_RDI->customMem).customFree;
                  in_stack_fffffffffffffe38 = (ZSTD_DDict *)(in_RDI->customMem).opaque;
                  customMem_00.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffe48;
                  customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffe40;
                  customMem_00.opaque = in_stack_fffffffffffffe50;
                  pcVar6 = (char *)ZSTD_customMalloc((size_t)in_stack_fffffffffffffe28,customMem_00)
                  ;
                  in_RDI->inBuff = pcVar6;
                  if (in_RDI->inBuff == (char *)0x0) {
                    return 0xffffffffffffffc0;
                  }
                }
                else {
                  if (in_RDI->staticSize < 0x176e0) {
                    __assert_fail("zds->staticSize >= sizeof(ZSTD_DCtx)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xa3e3,
                                  "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                                 );
                  }
                  if (in_RDI->staticSize - 0x176e0 < (long)((pZVar8->entropy).LLTable + -4) + uVar12
                     ) {
                    return 0xffffffffffffffc0;
                  }
                }
                in_RDI->inBuffSize = uVar12;
                in_RDI->outBuff = in_RDI->inBuff + in_RDI->inBuffSize;
                in_RDI->outBuffSize = (size_t)pZVar8;
              }
              in_RDI->streamStage = zdss_read;
switchD_002f7d08_caseD_2:
              sVar11 = ZSTD_nextSrcSizeToDecompressWithInputSize
                                 (in_RDI,(long)local_130 - (long)local_40);
              if (sVar11 == 0) {
                in_RDI->streamStage = zdss_init;
                bVar1 = false;
              }
              else if ((ulong)((long)local_130 - (long)local_40) < sVar11) {
                if (local_40 == local_130) {
                  bVar1 = false;
                }
                else {
                  in_RDI->streamStage = zdss_load;
switchD_002f7d08_caseD_3:
                  in_stack_fffffffffffffe50 = (void *)ZSTD_nextSrcSizeToDecompress(in_RDI);
                  pZVar8 = (ZSTD_DCtx *)((long)in_stack_fffffffffffffe50 - in_RDI->inPos);
                  iVar4 = ZSTD_isSkipFrame(in_RDI);
                  pvVar9 = (void *)ZSTD_nextSrcSizeToDecompressWithInputSize
                                             (in_RDI,(long)local_130 - (long)local_40);
                  if (in_stack_fffffffffffffe50 != pvVar9) {
                    __assert_fail("neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip))"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,41999,
                                  "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                                 );
                  }
                  if (iVar4 == 0) {
                    if ((ZSTD_DCtx *)(in_RDI->inBuffSize - in_RDI->inPos) < pZVar8) {
                      return 0xffffffffffffffec;
                    }
                    local_100 = (ZSTD_DCtx *)
                                ZSTD_limitCopy(in_stack_fffffffffffffe50,
                                               (size_t)in_stack_fffffffffffffe48,
                                               in_stack_fffffffffffffe40,
                                               (size_t)in_stack_fffffffffffffe38);
                  }
                  else {
                    in_stack_fffffffffffffe48 = pZVar8;
                    local_100 = pZVar8;
                    if ((ZSTD_DCtx *)((long)local_130 - (long)local_40) <= pZVar8) {
                      in_stack_fffffffffffffe48 = (ZSTD_DCtx *)((long)local_130 - (long)local_40);
                      local_100 = (ZSTD_DCtx *)((long)local_130 - (long)local_40);
                    }
                  }
                  if (local_100 != (ZSTD_DCtx *)0x0) {
                    local_40 = (void *)((long)local_40 + (long)(&local_100->entropy + -1) + 0x6a7c);
                    in_RDI->inPos = (long)((local_100->entropy).LLTable + -4) + in_RDI->inPos;
                  }
                  if (local_100 < pZVar8) {
                    bVar1 = false;
                  }
                  else {
                    in_RDI->inPos = 0;
                    sVar11 = ZSTD_decompressContinueStream
                                       (in_stack_fffffffffffffe88,(char **)in_stack_fffffffffffffe80
                                        ,(char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70
                                        ,CONCAT44(in_stack_fffffffffffffe6c,
                                                  in_stack_fffffffffffffe68));
                    uVar2 = ERR_isError(sVar11);
                    if (uVar2 != 0) {
                      return sVar11;
                    }
                  }
                }
              }
              else {
                sVar7 = ZSTD_decompressContinueStream
                                  (in_stack_fffffffffffffe88,(char **)in_stack_fffffffffffffe80,
                                   (char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
                uVar2 = ERR_isError(sVar7);
                if (uVar2 != 0) {
                  return sVar7;
                }
                if (local_40 == (void *)0x0) {
                  __assert_fail("ip != NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xa400,
                                "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                               );
                }
                local_40 = (void *)(sVar11 + (long)local_40);
              }
            }
            else {
              in_stack_fffffffffffffe88 = in_RDI;
              ZSTD_getDDict(in_stack_fffffffffffffe28);
              sVar7 = ZSTD_decompress_usingDDict
                                (in_stack_fffffffffffffe60,
                                 (void *)CONCAT17(in_stack_fffffffffffffe5f,
                                                  in_stack_fffffffffffffe58),
                                 (size_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                                 (size_t)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
              uVar2 = ZSTD_isError(0x2f8213);
              if (uVar2 != 0) {
                return sVar7;
              }
              if (local_128 == (void *)0x0) {
                __assert_fail("istart != NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa3aa,
                              "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                             );
              }
              local_40 = (void *)((long)local_128 + sVar11);
              if (local_60 != (ZSTD_DDict *)0x0) {
                local_60 = (ZSTD_DDict *)((long)((local_60->entropy).LLTable + -3) + sVar7);
              }
              in_RDI->expected = 0;
              in_RDI->streamStage = zdss_init;
              bVar1 = false;
              in_stack_fffffffffffffe80 = local_60;
            }
          }
          else {
            __n = sVar11 - in_RDI->lhSize;
            __n_00 = (long)local_130 - (long)local_40;
            if (local_130 < local_40) {
              __assert_fail("iend >= ip",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa38d,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
            if (__n_00 < __n) {
              if (__n_00 != 0) {
                memcpy(in_RDI->headerBuffer + in_RDI->lhSize,local_40,__n_00);
                in_RDI->lhSize = __n_00 + in_RDI->lhSize;
              }
              in_RDX[2] = in_RDX[1];
              sVar7 = ZSTD_getFrameHeader_advanced((ZSTD_frameHeader *)zfhPtr,src_00,uVar12,format);
              uVar2 = ERR_isError(sVar7);
              if (uVar2 != 0) {
                return sVar7;
              }
              iVar4 = 2;
              if (in_RDI->format == ZSTD_f_zstd1) {
                iVar4 = 6;
              }
              if (sVar11 < (ulong)(long)iVar4) {
                iVar4 = 2;
                if (in_RDI->format == ZSTD_f_zstd1) {
                  iVar4 = 6;
                }
                sVar11 = (size_t)iVar4;
              }
              return (sVar11 - in_RDI->lhSize) + 3;
            }
            if (local_40 == (void *)0x0) {
              __assert_fail("ip != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa39b,
                            "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                           );
            }
            memcpy(in_RDI->headerBuffer + in_RDI->lhSize,local_40,__n);
            in_RDI->lhSize = sVar11;
            local_40 = (void *)(__n + (long)local_40);
          }
          break;
        case 2:
          goto switchD_002f7d08_caseD_2;
        case 3:
          goto switchD_002f7d08_caseD_3;
        case 4:
          sVar11 = in_RDI->outEnd;
          sVar7 = in_RDI->outStart;
          sVar10 = ZSTD_limitCopy(in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48,
                                  in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
          if (local_60 != (ZSTD_DDict *)0x0) {
            local_60 = (ZSTD_DDict *)((long)((local_60->entropy).LLTable + -3) + sVar10);
          }
          in_RDI->outStart = sVar10 + in_RDI->outStart;
          in_stack_fffffffffffffe40 = local_60;
          if (sVar10 == sVar11 - sVar7) {
            in_RDI->streamStage = zdss_read;
            if ((in_RDI->outBuffSize < (in_RDI->fParams).frameContentSize) &&
               (in_RDI->outBuffSize < in_RDI->outStart + (ulong)(in_RDI->fParams).blockSizeMax)) {
              in_RDI->outEnd = 0;
              in_RDI->outStart = 0;
            }
          }
          else {
            bVar1 = false;
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa43d,
                        "size_t ZSTD_decompressStream(ZSTD_DStream *, ZSTD_outBuffer *, ZSTD_inBuffer *)"
                       );
        }
      } while( true );
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_decompressStream(ZSTD_DStream* zds, ZSTD_outBuffer* output, ZSTD_inBuffer* input)
{
    const char* const src = (const char*)input->src;
    const char* const istart = input->pos != 0 ? src + input->pos : src;
    const char* const iend = input->size != 0 ? src + input->size : src;
    const char* ip = istart;
    char* const dst = (char*)output->dst;
    char* const ostart = output->pos != 0 ? dst + output->pos : dst;
    char* const oend = output->size != 0 ? dst + output->size : dst;
    char* op = ostart;
    U32 someMoreWork = 1;

    DEBUGLOG(5, "ZSTD_decompressStream");
    RETURN_ERROR_IF(
        input->pos > input->size,
        srcSize_wrong,
        "forbidden. in: pos: %u   vs size: %u",
        (U32)input->pos, (U32)input->size);
    RETURN_ERROR_IF(
        output->pos > output->size,
        dstSize_tooSmall,
        "forbidden. out: pos: %u   vs size: %u",
        (U32)output->pos, (U32)output->size);
    DEBUGLOG(5, "input size : %u", (U32)(input->size - input->pos));
    FORWARD_IF_ERROR(ZSTD_checkOutBuffer(zds, output), "");

    while (someMoreWork) {
        switch(zds->streamStage)
        {
        case zdss_init :
            DEBUGLOG(5, "stage zdss_init => transparent reset ");
            zds->streamStage = zdss_loadHeader;
            zds->lhSize = zds->inPos = zds->outStart = zds->outEnd = 0;
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            zds->legacyVersion = 0;
#endif
            zds->hostageByte = 0;
            zds->expectedOutBuffer = *output;
            ZSTD_FALLTHROUGH;

        case zdss_loadHeader :
            DEBUGLOG(5, "stage zdss_loadHeader (srcSize : %u)", (U32)(iend - ip));
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
            if (zds->legacyVersion) {
                RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                    "legacy support is incompatible with static dctx");
                {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, zds->legacyVersion, output, input);
                    if (hint==0) zds->streamStage = zdss_init;
                    return hint;
            }   }
#endif
            {   size_t const hSize = ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format);
                if (zds->refMultipleDDicts && zds->ddictSet) {
                    ZSTD_DCtx_selectFrameDDict(zds);
                }
                if (ZSTD_isError(hSize)) {
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT>=1)
                    U32 const legacyVersion = ZSTD_isLegacy(istart, iend-istart);
                    if (legacyVersion) {
                        ZSTD_DDict const* const ddict = ZSTD_getDDict(zds);
                        const void* const dict = ddict ? ZSTD_DDict_dictContent(ddict) : NULL;
                        size_t const dictSize = ddict ? ZSTD_DDict_dictSize(ddict) : 0;
                        DEBUGLOG(5, "ZSTD_decompressStream: detected legacy version v0.%u", legacyVersion);
                        RETURN_ERROR_IF(zds->staticSize, memory_allocation,
                            "legacy support is incompatible with static dctx");
                        FORWARD_IF_ERROR(ZSTD_initLegacyStream(&zds->legacyContext,
                                    zds->previousLegacyVersion, legacyVersion,
                                    dict, dictSize), "");
                        zds->legacyVersion = zds->previousLegacyVersion = legacyVersion;
                        {   size_t const hint = ZSTD_decompressLegacyStream(zds->legacyContext, legacyVersion, output, input);
                            if (hint==0) zds->streamStage = zdss_init;   /* or stay in stage zdss_loadHeader */
                            return hint;
                    }   }
#endif
                    return hSize;   /* error */
                }
                if (hSize != 0) {   /* need more input */
                    size_t const toLoad = hSize - zds->lhSize;   /* if hSize!=0, hSize > zds->lhSize */
                    size_t const remainingInput = (size_t)(iend-ip);
                    assert(iend >= ip);
                    if (toLoad > remainingInput) {   /* not enough input to load full header */
                        if (remainingInput > 0) {
                            ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, remainingInput);
                            zds->lhSize += remainingInput;
                        }
                        input->pos = input->size;
                        /* check first few bytes */
                        FORWARD_IF_ERROR(
                            ZSTD_getFrameHeader_advanced(&zds->fParams, zds->headerBuffer, zds->lhSize, zds->format),
                            "First few bytes detected incorrect" );
                        /* return hint input size */
                        return (MAX((size_t)ZSTD_FRAMEHEADERSIZE_MIN(zds->format), hSize) - zds->lhSize) + ZSTD_blockHeaderSize;   /* remaining header bytes + next block header */
                    }
                    assert(ip != NULL);
                    ZSTD_memcpy(zds->headerBuffer + zds->lhSize, ip, toLoad); zds->lhSize = hSize; ip += toLoad;
                    break;
            }   }

            /* check for single-pass mode opportunity */
            if (zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && zds->fParams.frameType != ZSTD_skippableFrame
                && (U64)(size_t)(oend-op) >= zds->fParams.frameContentSize) {
                size_t const cSize = ZSTD_findFrameCompressedSize(istart, (size_t)(iend-istart));
                if (cSize <= (size_t)(iend-istart)) {
                    /* shortcut : using single-pass mode */
                    size_t const decompressedSize = ZSTD_decompress_usingDDict(zds, op, (size_t)(oend-op), istart, cSize, ZSTD_getDDict(zds));
                    if (ZSTD_isError(decompressedSize)) return decompressedSize;
                    DEBUGLOG(4, "shortcut to single-pass ZSTD_decompress_usingDDict()")
                    assert(istart != NULL);
                    ip = istart + cSize;
                    op = op ? op + decompressedSize : op; /* can occur if frameContentSize = 0 (empty frame) */
                    zds->expected = 0;
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
            }   }

            /* Check output buffer is large enough for ZSTD_odm_stable. */
            if (zds->outBufferMode == ZSTD_bm_stable
                && zds->fParams.frameType != ZSTD_skippableFrame
                && zds->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                && (U64)(size_t)(oend-op) < zds->fParams.frameContentSize) {
                RETURN_ERROR(dstSize_tooSmall, "ZSTD_obm_stable passed but ZSTD_outBuffer is too small");
            }

            /* Consume header (see ZSTDds_decodeFrameHeader) */
            DEBUGLOG(4, "Consume header");
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(zds, ZSTD_getDDict(zds)), "");

            if ((MEM_readLE32(zds->headerBuffer) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {  /* skippable frame */
                zds->expected = MEM_readLE32(zds->headerBuffer + ZSTD_FRAMEIDSIZE);
                zds->stage = ZSTDds_skipFrame;
            } else {
                FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(zds, zds->headerBuffer, zds->lhSize), "");
                zds->expected = ZSTD_blockHeaderSize;
                zds->stage = ZSTDds_decodeBlockHeader;
            }

            /* control buffer memory usage */
            DEBUGLOG(4, "Control max memory usage (%u KB <= max %u KB)",
                        (U32)(zds->fParams.windowSize >>10),
                        (U32)(zds->maxWindowSize >> 10) );
            zds->fParams.windowSize = MAX(zds->fParams.windowSize, 1U << ZSTD_WINDOWLOG_ABSOLUTEMIN);
            RETURN_ERROR_IF(zds->fParams.windowSize > zds->maxWindowSize,
                            frameParameter_windowTooLarge, "");

            /* Adapt buffer sizes to frame header instructions */
            {   size_t const neededInBuffSize = MAX(zds->fParams.blockSizeMax, 4 /* frame checksum */);
                size_t const neededOutBuffSize = zds->outBufferMode == ZSTD_bm_buffered
                        ? ZSTD_decodingBufferSize_min(zds->fParams.windowSize, zds->fParams.frameContentSize)
                        : 0;

                ZSTD_DCtx_updateOversizedDuration(zds, neededInBuffSize, neededOutBuffSize);

                {   int const tooSmall = (zds->inBuffSize < neededInBuffSize) || (zds->outBuffSize < neededOutBuffSize);
                    int const tooLarge = ZSTD_DCtx_isOversizedTooLong(zds);

                    if (tooSmall || tooLarge) {
                        size_t const bufferSize = neededInBuffSize + neededOutBuffSize;
                        DEBUGLOG(4, "inBuff  : from %u to %u",
                                    (U32)zds->inBuffSize, (U32)neededInBuffSize);
                        DEBUGLOG(4, "outBuff : from %u to %u",
                                    (U32)zds->outBuffSize, (U32)neededOutBuffSize);
                        if (zds->staticSize) {  /* static DCtx */
                            DEBUGLOG(4, "staticSize : %u", (U32)zds->staticSize);
                            assert(zds->staticSize >= sizeof(ZSTD_DCtx));  /* controlled at init */
                            RETURN_ERROR_IF(
                                bufferSize > zds->staticSize - sizeof(ZSTD_DCtx),
                                memory_allocation, "");
                        } else {
                            ZSTD_customFree(zds->inBuff, zds->customMem);
                            zds->inBuffSize = 0;
                            zds->outBuffSize = 0;
                            zds->inBuff = (char*)ZSTD_customMalloc(bufferSize, zds->customMem);
                            RETURN_ERROR_IF(zds->inBuff == NULL, memory_allocation, "");
                        }
                        zds->inBuffSize = neededInBuffSize;
                        zds->outBuff = zds->inBuff + zds->inBuffSize;
                        zds->outBuffSize = neededOutBuffSize;
            }   }   }
            zds->streamStage = zdss_read;
            ZSTD_FALLTHROUGH;

        case zdss_read:
            DEBUGLOG(5, "stage zdss_read");
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip));
                DEBUGLOG(5, "neededInSize = %u", (U32)neededInSize);
                if (neededInSize==0) {  /* end of frame */
                    zds->streamStage = zdss_init;
                    someMoreWork = 0;
                    break;
                }
                if ((size_t)(iend-ip) >= neededInSize) {  /* decode directly from src */
                    FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, ip, neededInSize), "");
                    assert(ip != NULL);
                    ip += neededInSize;
                    /* Function modifies the stage so we must break */
                    break;
            }   }
            if (ip==iend) { someMoreWork = 0; break; }   /* no more input */
            zds->streamStage = zdss_load;
            ZSTD_FALLTHROUGH;

        case zdss_load:
            {   size_t const neededInSize = ZSTD_nextSrcSizeToDecompress(zds);
                size_t const toLoad = neededInSize - zds->inPos;
                int const isSkipFrame = ZSTD_isSkipFrame(zds);
                size_t loadedSize;
                /* At this point we shouldn't be decompressing a block that we can stream. */
                assert(neededInSize == ZSTD_nextSrcSizeToDecompressWithInputSize(zds, (size_t)(iend - ip)));
                if (isSkipFrame) {
                    loadedSize = MIN(toLoad, (size_t)(iend-ip));
                } else {
                    RETURN_ERROR_IF(toLoad > zds->inBuffSize - zds->inPos,
                                    corruption_detected,
                                    "should never happen");
                    loadedSize = ZSTD_limitCopy(zds->inBuff + zds->inPos, toLoad, ip, (size_t)(iend-ip));
                }
                if (loadedSize != 0) {
                    /* ip may be NULL */
                    ip += loadedSize;
                    zds->inPos += loadedSize;
                }
                if (loadedSize < toLoad) { someMoreWork = 0; break; }   /* not enough input, wait for more */

                /* decode loaded input */
                zds->inPos = 0;   /* input is consumed */
                FORWARD_IF_ERROR(ZSTD_decompressContinueStream(zds, &op, oend, zds->inBuff, neededInSize), "");
                /* Function modifies the stage so we must break */
                break;
            }
        case zdss_flush:
            {
                size_t const toFlushSize = zds->outEnd - zds->outStart;
                size_t const flushedSize = ZSTD_limitCopy(op, (size_t)(oend-op), zds->outBuff + zds->outStart, toFlushSize);

                op = op ? op + flushedSize : op;

                zds->outStart += flushedSize;
                if (flushedSize == toFlushSize) {  /* flush completed */
                    zds->streamStage = zdss_read;
                    if ( (zds->outBuffSize < zds->fParams.frameContentSize)
                        && (zds->outStart + zds->fParams.blockSizeMax > zds->outBuffSize) ) {
                        DEBUGLOG(5, "restart filling outBuff from beginning (left:%i, needed:%u)",
                                (int)(zds->outBuffSize - zds->outStart),
                                (U32)zds->fParams.blockSizeMax);
                        zds->outStart = zds->outEnd = 0;
                    }
                    break;
            }   }
            /* cannot complete flush */
            someMoreWork = 0;
            break;

        default:
            assert(0);    /* impossible */
            RETURN_ERROR(GENERIC, "impossible to reach");   /* some compilers require default to do something */
    }   }

    /* result */
    input->pos = (size_t)(ip - (const char*)(input->src));
    output->pos = (size_t)(op - (char*)(output->dst));

    /* Update the expected output buffer for ZSTD_obm_stable. */
    zds->expectedOutBuffer = *output;

    if ((ip==istart) && (op==ostart)) {  /* no forward progress */
        zds->noForwardProgress ++;
        if (zds->noForwardProgress >= ZSTD_NO_FORWARD_PROGRESS_MAX) {
            RETURN_ERROR_IF(op==oend, noForwardProgress_destFull, "");
            RETURN_ERROR_IF(ip==iend, noForwardProgress_inputEmpty, "");
            assert(0);
        }
    } else {
        zds->noForwardProgress = 0;
    }
    {   size_t nextSrcSizeHint = ZSTD_nextSrcSizeToDecompress(zds);
        if (!nextSrcSizeHint) {   /* frame fully decoded */
            if (zds->outEnd == zds->outStart) {  /* output fully flushed */
                if (zds->hostageByte) {
                    if (input->pos >= input->size) {
                        /* can't release hostage (not present) */
                        zds->streamStage = zdss_read;
                        return 1;
                    }
                    input->pos++;  /* release hostage */
                }   /* zds->hostageByte */
                return 0;
            }  /* zds->outEnd == zds->outStart */
            if (!zds->hostageByte) { /* output not fully flushed; keep last byte as hostage; will be released when all output is flushed */
                input->pos--;   /* note : pos > 0, otherwise, impossible to finish reading last block */
                zds->hostageByte=1;
            }
            return 1;
        }  /* nextSrcSizeHint==0 */
        nextSrcSizeHint += ZSTD_blockHeaderSize * (ZSTD_nextInputType(zds) == ZSTDnit_block);   /* preload header of next block */
        assert(zds->inPos <= nextSrcSizeHint);
        nextSrcSizeHint -= zds->inPos;   /* part already loaded*/
        return nextSrcSizeHint;
    }
}